

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration
                   (string *__return_storage_ptr__,string *extension)

{
  ostream *poVar1;
  ostringstream source;
  ostringstream local_190 [376];
  
  if (extension->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)local_190);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,"#extension ");
    poVar1 = std::operator<<(poVar1,(string *)extension);
    std::operator<<(poVar1," : enable\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderExtensionDeclaration (std::string extension)
{
	if (extension.empty())
		return std::string("");
	else
	{
		std::ostringstream source;
		source << "#extension " << extension << " : enable\n";
		return source.str();
	}
}